

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O2

bool __thiscall MT32Emu::Synth::loadPCMROM(Synth *this,ROMImage *pcmROMImage)

{
  Bit16s *pBVar1;
  size_t sVar2;
  byte bVar3;
  int iVar4;
  File *pFVar5;
  ROMInfo *pRVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  byte *pbVar7;
  byte bVar8;
  size_t sVar9;
  char *pcVar10;
  int u;
  ulong uVar11;
  uint uVar12;
  
  pFVar5 = ROMImage::getFile(pcmROMImage);
  pRVar6 = ROMImage::getROMInfo(pcmROMImage);
  if ((((pRVar6 != (ROMInfo *)0x0) && (pRVar6->type == PCM)) && (pRVar6->pairType == Full)) &&
     (iVar4 = (*pFVar5->_vptr_File[2])(pFVar5), CONCAT44(extraout_var,iVar4) == this->pcmROMSize * 2
     )) {
    iVar4 = (*pFVar5->_vptr_File[3])(pFVar5);
    pbVar7 = (byte *)CONCAT44(extraout_var_00,iVar4);
    pBVar1 = this->pcmROMData;
    sVar2 = this->pcmROMSize;
    for (sVar9 = 0; sVar9 != sVar2; sVar9 = sVar9 + 1) {
      pcVar10 = "";
      bVar8 = 0xf;
      uVar12 = 0;
      for (uVar11 = 0; uVar11 != 0x10; uVar11 = uVar11 + 1) {
        bVar3 = pbVar7[1] >> (0xfU - *pcVar10 & 0x1f);
        if ((0x1fdUL >> (uVar11 & 0x3f) & 1) != 0) {
          bVar3 = *pbVar7 >> (7U - *pcVar10 & 0x1f);
        }
        uVar12 = uVar12 | (bVar3 & 1) << (bVar8 & 0x1f);
        bVar8 = bVar8 - 1;
        pcVar10 = pcVar10 + 4;
      }
      pbVar7 = pbVar7 + 2;
      pBVar1[sVar9] = (Bit16s)uVar12;
    }
    return true;
  }
  return false;
}

Assistant:

bool Synth::loadPCMROM(const ROMImage &pcmROMImage) {
	File *file = pcmROMImage.getFile();
	const ROMInfo *pcmROMInfo = pcmROMImage.getROMInfo();
	if ((pcmROMInfo == NULL)
			|| (pcmROMInfo->type != ROMInfo::PCM)
			|| (pcmROMInfo->pairType != ROMInfo::Full)) {
		return false;
	}
#if MT32EMU_MONITOR_INIT
	printDebug("Found PCM ROM: %s, %s", pcmROMInfo->shortName, pcmROMInfo->description);
#endif
	size_t fileSize = file->getSize();
	if (fileSize != (2 * pcmROMSize)) {
#if MT32EMU_MONITOR_INIT
		printDebug("PCM ROM file has wrong size (expected %d, got %d)", 2 * pcmROMSize, fileSize);
#endif
		return false;
	}
	const Bit8u *fileData = file->getData();
	for (size_t i = 0; i < pcmROMSize; i++) {
		Bit8u s = *(fileData++);
		Bit8u c = *(fileData++);

		int order[16] = {0, 9, 1, 2, 3, 4, 5, 6, 7, 10, 11, 12, 13, 14, 15, 8};

		Bit16s log = 0;
		for (int u = 0; u < 16; u++) {
			int bit;
			if (order[u] < 8) {
				bit = (s >> (7 - order[u])) & 0x1;
			} else {
				bit = (c >> (7 - (order[u] - 8))) & 0x1;
			}
			log = log | Bit16s(bit << (15 - u));
		}
		pcmROMData[i] = log;
	}
	return true;
}